

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freecell.c
# Opt level: O2

MovePack * freecell_movePackGet(Board *board)

{
  ulong uVar1;
  Card *pCVar2;
  Card *pCVar3;
  Card *from;
  byte *pbVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  SPOTTYPE SVar9;
  long lVar10;
  byte bVar11;
  _Bool _Var12;
  uint uVar13;
  MovePack *movePack;
  Spot *pSVar14;
  Move *pMVar15;
  int fromSpotCardIndex;
  ulong uVar16;
  uchar uVar17;
  ulong uVar18;
  long lVar19;
  byte bVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  undefined8 uStack_d0;
  int aiStack_c8 [2];
  ulong uStack_c0;
  Spot *pSStack_b8;
  Spot *cells [4];
  Spot *foundations [4];
  
  uStack_c0 = 0x103d74;
  movePack = movePack_create();
  uVar1 = (ulong)((gConfig.game)->id == SEAHAVENTOWERS) * 2 + 8;
  lVar8 = -(ulong)(uint)((int)uVar1 * 8);
  lVar10 = lVar8 + -0xb8;
  *(undefined8 *)((long)&uStack_c0 + lVar8) = 5;
  uVar5 = *(undefined8 *)((long)&uStack_c0 + lVar8);
  *(undefined8 *)((long)&uStack_c0 + lVar8) = 3;
  uVar6 = *(undefined8 *)((long)&uStack_c0 + lVar8);
  bVar11 = 0;
  for (uVar18 = 0; uVar1 != uVar18; uVar18 = uVar18 + 1) {
    uVar17 = (uchar)uVar18;
    if (uVar18 < 4) {
      *(undefined8 *)((long)&uStack_c0 + lVar8) = 4;
      uVar7 = *(undefined8 *)((long)&uStack_c0 + lVar8);
      *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x103ddc;
      pSVar14 = board_spotGet(board,(SPOTTYPE)uVar7,uVar17);
      cells[uVar18 + 3] = pSVar14;
      *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x103df2;
      pSVar14 = board_spotGet(board,(SPOTTYPE)uVar5,uVar17);
      cells[uVar18 - 1] = pSVar14;
      bVar11 = bVar11 + (pSVar14->cardsCount == '\0');
    }
    *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x103e16;
    pSVar14 = board_spotGet(board,(SPOTTYPE)uVar6,uVar17);
    *(Spot **)((long)cells + uVar18 * 8 + lVar10 + 0xb0) = pSVar14;
  }
  *(undefined8 *)((long)&uStack_c0 + lVar8) = 0xffffffffffffffff;
  uVar5 = *(undefined8 *)((long)&uStack_c0 + lVar8);
  for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
    bVar20 = cells[lVar19 + -1]->cardsCount;
    if (bVar20 != 0) {
      uVar18 = 0;
      pCVar2 = cells[lVar19 + -1]->cards[bVar20 - 1];
      while( true ) {
        fromSpotCardIndex = (int)uVar5;
        uVar17 = (uchar)lVar19;
        if (uVar1 == uVar18) break;
        lVar22 = *(long *)((long)cells + uVar18 * 8 + lVar10 + 0xb0);
        bVar20 = *(byte *)(lVar22 + 2);
        if (bVar20 == 0) {
          if ((((gConfig.game)->id != SEAHAVENTOWERS) && ((gConfig.game)->id != BAKERSGAMEKINGSONLY)
              ) || (pCVar2->rank == '\r')) goto LAB_00103ebc;
        }
        else {
          pCVar3 = *(Card **)(*(long *)(lVar22 + 8) + (ulong)(bVar20 - 1) * 8);
          *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x103e97;
          _Var12 = freecell_validCardTableauDrop(pCVar2,pCVar3);
          if (_Var12) {
LAB_00103ebc:
            *(undefined8 *)((long)aiStack_c8 + lVar8) = 5;
            uVar6 = *(undefined8 *)((long)aiStack_c8 + lVar8);
            *(undefined8 *)((long)aiStack_c8 + lVar8) = 3;
            uVar7 = *(undefined8 *)((long)aiStack_c8 + lVar8);
            *(undefined8 *)((long)aiStack_c8 + lVar8) = 0xffffffffffffffff;
            *(undefined8 *)((long)&uStack_d0 + lVar8) = 0x103eda;
            pMVar15 = move_create(MOVE,(SPOTTYPE)uVar6,uVar17,fromSpotCardIndex,(SPOTTYPE)uVar7,
                                  (uchar)uVar18,*(int *)((long)aiStack_c8 + lVar8));
            *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x103ee7;
            movePack_add(movePack,pMVar15);
          }
        }
        uVar18 = uVar18 + 1;
      }
      for (lVar22 = 0; lVar22 != 4; lVar22 = lVar22 + 1) {
        bVar20 = cells[lVar22 + 3]->cardsCount;
        if (bVar20 == 0) {
          if (pCVar2->rank == 1) {
            *(undefined4 *)((long)aiStack_c8 + lVar8) = 0xffffffff;
            *(undefined8 *)((long)&uStack_d0 + lVar8) = 5;
            uVar6 = *(undefined8 *)((long)&uStack_d0 + lVar8);
            *(undefined8 *)((long)&uStack_d0 + lVar8) = 4;
            uVar7 = *(undefined8 *)((long)&uStack_d0 + lVar8);
            *(undefined8 *)((long)&uStack_d0 + lVar8) = 0x103f9c;
            pMVar15 = move_create(MOVE,(SPOTTYPE)uVar6,uVar17,fromSpotCardIndex,(SPOTTYPE)uVar7,
                                  (uchar)lVar22,*(int *)((long)aiStack_c8 + lVar8));
            *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x103faa;
            movePack_add(movePack,pMVar15);
            break;
          }
        }
        else {
          pCVar3 = cells[lVar22 + 3]->cards[bVar20 - 1];
          if ((pCVar3->rank + 1 == (uint)pCVar2->rank) && (pCVar2->suit == pCVar3->suit)) {
            *(undefined8 *)((long)aiStack_c8 + lVar8) = 5;
            uVar6 = *(undefined8 *)((long)aiStack_c8 + lVar8);
            *(undefined8 *)((long)aiStack_c8 + lVar8) = 4;
            uVar7 = *(undefined8 *)((long)aiStack_c8 + lVar8);
            *(undefined8 *)((long)aiStack_c8 + lVar8) = 0xffffffffffffffff;
            *(undefined8 *)((long)&uStack_d0 + lVar8) = 0x103f5a;
            pMVar15 = move_create(MOVE,(SPOTTYPE)uVar6,uVar17,fromSpotCardIndex,(SPOTTYPE)uVar7,
                                  (uchar)lVar22,*(int *)((long)aiStack_c8 + lVar8));
            *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x103f68;
            movePack_add(movePack,pMVar15);
          }
        }
      }
    }
  }
  for (uVar18 = 0; uVar18 != uVar1; uVar18 = uVar18 + 1) {
    lVar19 = *(long *)((long)cells + uVar18 * 8 + lVar10 + 0xb0);
    bVar20 = *(byte *)(lVar19 + 2);
    if (bVar20 != 0) {
      *(undefined8 *)((long)&uStack_c0 + lVar8) = 1;
      uVar16 = *(ulong *)((long)&uStack_c0 + lVar8);
      uVar23 = 0;
LAB_00103fea:
      if (uVar23 < bVar20) {
        if ((int)((uint)bVar20 - (int)uVar23) <= (int)(bVar11 + 1)) {
          lVar22 = *(long *)(lVar19 + 8);
          pCVar2 = *(Card **)(lVar22 + uVar23 * 8);
          uVar21 = uVar16;
          do {
            if (bVar20 <= uVar21) {
              uVar21 = 0;
              goto LAB_00104058;
            }
            pCVar3 = *(Card **)(lVar22 + -8 + uVar21 * 8);
            from = *(Card **)(lVar22 + uVar21 * 8);
            *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x104033;
            _Var12 = freecell_validCardTableauDrop(from,pCVar3);
            uVar21 = uVar21 + 1;
          } while (_Var12);
        }
        goto LAB_00104107;
      }
    }
  }
  lVar19 = 0;
  while( true ) {
    if (lVar19 == 4) goto LAB_00104191;
    if (cells[lVar19 + -1]->cardsCount == '\0') break;
    lVar19 = lVar19 + 1;
  }
  *(undefined8 *)((long)&uStack_c0 + lVar8) = 0xffffffffffffffff;
  uVar5 = *(undefined8 *)((long)&uStack_c0 + lVar8);
  *(undefined8 *)((long)&uStack_c0 + lVar8) = 5;
  uVar6 = *(undefined8 *)((long)&uStack_c0 + lVar8);
  for (uVar18 = 0; uVar1 != uVar18; uVar18 = uVar18 + 1) {
    if (*(char *)(*(long *)((long)cells + uVar18 * 8 + lVar10 + 0xb0) + 2) != '\0') {
      *(undefined4 *)((long)aiStack_c8 + lVar8) = 0xffffffff;
      *(undefined8 *)((long)&uStack_d0 + lVar8) = 3;
      uVar7 = *(undefined8 *)((long)&uStack_d0 + lVar8);
      *(undefined8 *)((long)&uStack_d0 + lVar8) = 0x10417e;
      pMVar15 = move_create(MOVE,(SPOTTYPE)uVar7,(uchar)uVar18,(int)uVar5,(SPOTTYPE)uVar6,
                            (uchar)lVar19,*(int *)((long)aiStack_c8 + lVar8));
      *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x10418c;
      movePack_add(movePack,pMVar15);
    }
  }
LAB_00104191:
  uVar18 = 0;
  *(undefined8 *)((long)&uStack_c0 + lVar8) = 4;
  uVar5 = *(undefined8 *)((long)&uStack_c0 + lVar8);
  do {
    if (uVar18 == uVar1) {
      return movePack;
    }
    lVar19 = *(long *)((long)cells + uVar18 * 8 + lVar10 + 0xb0);
    bVar11 = *(byte *)(lVar19 + 2);
    if (bVar11 != 0) {
      pbVar4 = *(byte **)(*(long *)(lVar19 + 8) + (ulong)(bVar11 - 1) * 8);
      for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
        bVar11 = cells[lVar19 + 3]->cardsCount;
        uVar13 = (uint)*pbVar4;
        SVar9 = (SPOTTYPE)uVar5;
        if (bVar11 == 0) {
          if (uVar13 == 1) {
            *(undefined4 *)((long)aiStack_c8 + lVar8) = 0xffffffff;
            *(undefined8 *)((long)&uStack_d0 + lVar8) = 3;
            uVar6 = *(undefined8 *)((long)&uStack_d0 + lVar8);
            *(undefined8 *)((long)&uStack_d0 + lVar8) = 0xffffffffffffffff;
            uVar7 = *(undefined8 *)((long)&uStack_d0 + lVar8);
            *(undefined8 *)((long)&uStack_d0 + lVar8) = 0x10426a;
            pMVar15 = move_create(MOVE,(SPOTTYPE)uVar6,(uchar)uVar18,(int)uVar7,SVar9,(uchar)lVar19,
                                  *(int *)((long)aiStack_c8 + lVar8));
            *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x104278;
            movePack_add(movePack,pMVar15);
            break;
          }
        }
        else {
          pCVar2 = cells[lVar19 + 3]->cards[bVar11 - 1];
          if ((pCVar2->rank + 1 == uVar13) && (pbVar4[1] == pCVar2->suit)) {
            *(undefined8 *)((long)aiStack_c8 + lVar8) = 3;
            uVar6 = *(undefined8 *)((long)aiStack_c8 + lVar8);
            *(undefined8 *)((long)aiStack_c8 + lVar8) = 0xffffffffffffffff;
            uVar7 = *(undefined8 *)((long)aiStack_c8 + lVar8);
            *(undefined8 *)((long)aiStack_c8 + lVar8) = 0xffffffffffffffff;
            *(undefined8 *)((long)&uStack_d0 + lVar8) = 0x104228;
            pMVar15 = move_create(MOVE,(SPOTTYPE)uVar6,(uchar)uVar18,(int)uVar7,SVar9,(uchar)lVar19,
                                  *(int *)((long)aiStack_c8 + lVar8));
            *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x104236;
            movePack_add(movePack,pMVar15);
          }
        }
      }
    }
    uVar18 = uVar18 + 1;
  } while( true );
LAB_00104058:
  if (uVar1 == uVar21) goto LAB_001040f8;
  if (uVar18 != uVar21) {
    lVar22 = *(long *)((long)cells + uVar21 * 8 + lVar10 + 0xb0);
    bVar20 = *(byte *)(lVar22 + 2);
    if ((uVar23 == 0) || (bVar20 != 0)) {
      if (bVar20 != 0) {
        pCVar3 = *(Card **)(*(long *)(lVar22 + 8) + (ulong)(bVar20 - 1) * 8);
        *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x1040c1;
        _Var12 = freecell_validCardTableauDrop(pCVar2,pCVar3);
        if (_Var12) goto LAB_001040c5;
      }
    }
    else if ((((gConfig.game)->id != SEAHAVENTOWERS) && ((gConfig.game)->id != BAKERSGAMEKINGSONLY))
            || (pCVar2->rank == '\r')) {
LAB_001040c5:
      *(undefined8 *)((long)aiStack_c8 + lVar8) = 3;
      SVar9 = (SPOTTYPE)*(undefined8 *)((long)aiStack_c8 + lVar8);
      *(undefined8 *)((long)aiStack_c8 + lVar8) = 0xffffffffffffffff;
      *(undefined8 *)((long)&uStack_d0 + lVar8) = 0x1040e3;
      pMVar15 = move_create(MOVE,SVar9,(uchar)uVar18,(int)uVar23,SVar9,(uchar)uVar21,
                            *(int *)((long)aiStack_c8 + lVar8));
      *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x1040f0;
      movePack_add(movePack,pMVar15);
    }
  }
  uVar21 = uVar21 + 1;
  goto LAB_00104058;
LAB_001040f8:
  bVar20 = *(byte *)(lVar19 + 2);
LAB_00104107:
  uVar23 = uVar23 + 1;
  uVar16 = uVar16 + 1;
  goto LAB_00103fea;
}

Assistant:

MovePack * freecell_movePackGet(Board * board)
{
	MovePack * movePack = movePack_create();
	unsigned char i, j, k;
	unsigned char openCellCount=0;
	unsigned char tableauCount = gConfig.game->id==SEAHAVENTOWERS ? 10 : 8;
	bool correctlyStacked;
	Spot * cells[4];
	Spot * foundations[4];
	Spot * tableaus[tableauCount];
	Card * card;

	for(i=0;i<tableauCount;i++)
	{
		if(i<4)
		{
			foundations[i] = board_spotGet(board, FOUNDATION, i);
			cells[i] = board_spotGet(board, CELL, i);
			if(cells[i]->cardsCount==0)
				openCellCount++;
		}
		tableaus[i] = board_spotGet(board, TABLEAU, i);
	}

	// Cell
	for(i=0;i<4;i++)
	{
		if(cells[i]->cardsCount==0)
			continue;

		card = cells[i]->cards[cells[i]->cardsCount-1];

		// Cell->Tableau
		for(j=0;j<tableauCount;j++)
		{
			if((tableaus[j]->cardsCount==0 && ((gConfig.game->id!=BAKERSGAMEKINGSONLY && gConfig.game->id!=SEAHAVENTOWERS) || card->rank==13)) || (tableaus[j]->cardsCount>0 && freecell_validCardTableauDrop(card, tableaus[j]->cards[tableaus[j]->cardsCount-1])))
				movePack_add(movePack, move_create(MOVE, CELL, i, -1, TABLEAU, j, -1));
		}

		// Cell->Foundation
		for(j=0;j<4;j++)
		{
			if(foundations[j]->cardsCount==0 && card->rank==1)
			{
				movePack_add(movePack, move_create(MOVE, CELL, i, -1, FOUNDATION, j, -1));
				// All empty foundations are created equal, if moving an Ace, there is no need to entertain moving to the other foundations
				break;
			}
			else if(foundations[j]->cardsCount>0 && card->rank==foundations[j]->cards[foundations[j]->cardsCount-1]->rank+1 && card->suit==foundations[j]->cards[foundations[j]->cardsCount-1]->suit)
			{
				movePack_add(movePack, move_create(MOVE, CELL, i, -1, FOUNDATION, j, -1));
			}
		}
	}

	// Tableau->Tableau
	for(i=0;i<tableauCount;i++)
	{
		if(tableaus[i]->cardsCount==0)
			continue;

		for(j=0;j<tableaus[i]->cardsCount;j++)
		{
			card = tableaus[i]->cards[j];

			// Ensure stack not too long
			if((tableaus[i]->cardsCount-j)>(openCellCount+1))
				continue;

			// And is correctly stacked
			for(correctlyStacked=true,k=(j+1);k<tableaus[i]->cardsCount;k++)
			{
				if(!freecell_validCardTableauDrop(tableaus[i]->cards[k], tableaus[i]->cards[(k-1)]))
				{
					correctlyStacked = false;
					break;
				}
			}

			if(!correctlyStacked)
				continue;

			//printf("tableau %d at index %d has correctly ranked card: %s\n", i, j, card_print(card, false));

			for(k=0;k<tableauCount;k++)
			{
				if(k==i)
					continue;

				if((tableaus[k]->cardsCount==0 && j>0 && ((gConfig.game->id!=BAKERSGAMEKINGSONLY && gConfig.game->id!=SEAHAVENTOWERS) || card->rank==13)) ||
				   (tableaus[k]->cardsCount>0 && freecell_validCardTableauDrop(card, tableaus[k]->cards[tableaus[k]->cardsCount-1])))
				{
					movePack_add(movePack, move_create(MOVE, TABLEAU, i, j, TABLEAU, k, -1));
				}
			}
		}
	}

	// Tableau->Cell
	for(i=0;i<4;i++)
	{
		if(cells[i]->cardsCount>0)
			continue;

		for(j=0;j<tableauCount;j++)
		{
			if(tableaus[j]->cardsCount==0)
				continue;

			movePack_add(movePack, move_create(MOVE, TABLEAU, j, -1, CELL, i, -1));
		}

		break;
	}

	// Tableau->Foundation
	for(i=0;i<tableauCount;i++)
	{
		if(tableaus[i]->cardsCount==0)
			continue;

		card = tableaus[i]->cards[tableaus[i]->cardsCount-1];

		for(j=0;j<4;j++)
		{
			if(foundations[j]->cardsCount==0 && card->rank==1)
			{
				movePack_add(movePack, move_create(MOVE, TABLEAU, i, -1, FOUNDATION, j, -1));
				// All empty foundations are created equal, if moving an Ace, there is no need to entertain moving to the other foundations
				break;
			   
			}
			else if(foundations[j]->cardsCount>0 && card->rank==foundations[j]->cards[foundations[j]->cardsCount-1]->rank+1 && card->suit==foundations[j]->cards[foundations[j]->cardsCount-1]->suit)
			{
				movePack_add(movePack, move_create(MOVE, TABLEAU, i, -1, FOUNDATION, j, -1));
			}
		}
	}

	return movePack;
}